

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicatevisitor.cpp
# Opt level: O2

void __thiscall
PredicateVisitor::visit
          (PredicateVisitor *this,Expression *parent,BinaryOperatorExpression *expression)

{
  bool bVar1;
  
  if (this->mHasResult == false) {
    DfsVisitor::visit(&this->super_DfsVisitor,parent,expression);
    bVar1 = std::function<bool_(Expression_*)>::operator()
                      (&this->mPredicate,&expression->super_Expression);
    if (bVar1) {
      this->mHasResult = true;
    }
  }
  return;
}

Assistant:

void PredicateVisitor::visit(Expression* parent, BinaryOperatorExpression* expression) {
	if (mHasResult) {
		return;
	}

	DfsVisitor::visit(parent, expression);

	if (mPredicate(expression)) {
		mHasResult = true;
	}
}